

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O0

size_t KeccakP1600_12rounds_FastLoop_Absorb
                 (void *state,uint laneCount,uchar *data,size_t dataByteLen)

{
  __uint64_t _Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong in_RCX;
  __uint64_t *in_RDX;
  uint in_ESI;
  ulong *in_RDI;
  uint64_t *inDataAsLanes;
  uint64_t *stateAsLanes;
  uint64_t Esu;
  uint64_t Eso;
  uint64_t Esi;
  uint64_t Ese;
  uint64_t Esa;
  uint64_t Emu;
  uint64_t Emo;
  uint64_t Emi;
  uint64_t Eme;
  uint64_t Ema;
  uint64_t Eku;
  uint64_t Eko;
  uint64_t Eki;
  uint64_t Eke;
  uint64_t Eka;
  uint64_t Egu;
  uint64_t Ego;
  uint64_t Egi;
  uint64_t Ege;
  uint64_t Ega;
  uint64_t Ebu;
  uint64_t Ebo;
  uint64_t Ebi;
  uint64_t Ebe;
  uint64_t Eba;
  uint64_t Du;
  uint64_t Do;
  uint64_t Di;
  uint64_t De;
  uint64_t Da;
  uint64_t Cu;
  uint64_t Co;
  uint64_t Ci;
  uint64_t Ce;
  uint64_t Ca;
  uint64_t Bsu;
  uint64_t Bso;
  uint64_t Bsi;
  uint64_t Bse;
  uint64_t Bsa;
  uint64_t Bmu;
  uint64_t Bmo;
  uint64_t Bmi;
  uint64_t Bme;
  uint64_t Bma;
  uint64_t Bku;
  uint64_t Bko;
  uint64_t Bki;
  uint64_t Bke;
  uint64_t Bka;
  uint64_t Bgu;
  uint64_t Bgo;
  uint64_t Bgi;
  uint64_t Bge;
  uint64_t Bga;
  uint64_t Bbu;
  uint64_t Bbo;
  uint64_t Bbi;
  uint64_t Bbe;
  uint64_t Bba;
  uint64_t Asu;
  uint64_t Aso;
  uint64_t Asi;
  uint64_t Ase;
  uint64_t Asa;
  uint64_t Amu;
  uint64_t Amo;
  uint64_t Ami;
  uint64_t Ame;
  uint64_t Ama;
  uint64_t Aku;
  uint64_t Ako;
  uint64_t Aki;
  uint64_t Ake;
  uint64_t Aka;
  uint64_t Agu;
  uint64_t Ago;
  uint64_t Agi;
  uint64_t Age;
  uint64_t Aga;
  uint64_t Abu;
  uint64_t Abo;
  uint64_t Abi;
  uint64_t Abe;
  uint64_t Aba;
  size_t originalDataByteLen;
  __uint64_t *local_2e0;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_20;
  
  local_30 = *in_RDI;
  local_38 = in_RDI[1];
  local_40 = in_RDI[2];
  local_48 = in_RDI[3];
  local_50 = in_RDI[4];
  local_58 = in_RDI[5];
  local_60 = in_RDI[6];
  local_68 = in_RDI[7];
  local_70 = in_RDI[8];
  local_78 = in_RDI[9];
  local_80 = in_RDI[10];
  local_88 = in_RDI[0xb];
  local_90 = in_RDI[0xc];
  local_98 = in_RDI[0xd];
  local_a0 = in_RDI[0xe];
  local_a8 = in_RDI[0xf];
  local_b0 = in_RDI[0x10];
  local_b8 = in_RDI[0x11];
  local_c0 = in_RDI[0x12];
  local_c8 = in_RDI[0x13];
  local_d0 = in_RDI[0x14];
  local_d8 = in_RDI[0x15];
  local_e0 = in_RDI[0x16];
  local_e8 = in_RDI[0x17];
  local_f0 = in_RDI[0x18];
  local_2e0 = in_RDX;
  for (local_20 = in_RCX; in_ESI << 3 <= local_20; local_20 = local_20 - (in_ESI << 3)) {
    if (in_ESI == 0x15) {
      _Var1 = __uint64_identity(*local_2e0);
      local_30 = _Var1 ^ local_30;
      _Var1 = __uint64_identity(local_2e0[1]);
      local_38 = _Var1 ^ local_38;
      _Var1 = __uint64_identity(local_2e0[2]);
      local_40 = _Var1 ^ local_40;
      _Var1 = __uint64_identity(local_2e0[3]);
      local_48 = _Var1 ^ local_48;
      _Var1 = __uint64_identity(local_2e0[4]);
      local_50 = _Var1 ^ local_50;
      _Var1 = __uint64_identity(local_2e0[5]);
      local_58 = _Var1 ^ local_58;
      _Var1 = __uint64_identity(local_2e0[6]);
      local_60 = _Var1 ^ local_60;
      _Var1 = __uint64_identity(local_2e0[7]);
      local_68 = _Var1 ^ local_68;
      _Var1 = __uint64_identity(local_2e0[8]);
      local_70 = _Var1 ^ local_70;
      _Var1 = __uint64_identity(local_2e0[9]);
      local_78 = _Var1 ^ local_78;
      _Var1 = __uint64_identity(local_2e0[10]);
      local_80 = _Var1 ^ local_80;
      _Var1 = __uint64_identity(local_2e0[0xb]);
      local_88 = _Var1 ^ local_88;
      _Var1 = __uint64_identity(local_2e0[0xc]);
      local_90 = _Var1 ^ local_90;
      _Var1 = __uint64_identity(local_2e0[0xd]);
      local_98 = _Var1 ^ local_98;
      _Var1 = __uint64_identity(local_2e0[0xe]);
      local_a0 = _Var1 ^ local_a0;
      _Var1 = __uint64_identity(local_2e0[0xf]);
      local_a8 = _Var1 ^ local_a8;
      _Var1 = __uint64_identity(local_2e0[0x10]);
      local_b0 = _Var1 ^ local_b0;
      _Var1 = __uint64_identity(local_2e0[0x11]);
      local_b8 = _Var1 ^ local_b8;
      _Var1 = __uint64_identity(local_2e0[0x12]);
      local_c0 = _Var1 ^ local_c0;
      _Var1 = __uint64_identity(local_2e0[0x13]);
      local_c8 = _Var1 ^ local_c8;
      _Var1 = __uint64_identity(local_2e0[0x14]);
      local_d0 = _Var1 ^ local_d0;
    }
    else if (in_ESI < 0x10) {
      if (in_ESI < 8) {
        if (in_ESI < 4) {
          if (in_ESI < 2) {
            if (in_ESI != 0) {
              _Var1 = __uint64_identity(*local_2e0);
              local_30 = _Var1 ^ local_30;
            }
          }
          else {
            _Var1 = __uint64_identity(*local_2e0);
            local_30 = _Var1 ^ local_30;
            _Var1 = __uint64_identity(local_2e0[1]);
            local_38 = _Var1 ^ local_38;
            if (2 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[2]);
              local_40 = _Var1 ^ local_40;
            }
          }
        }
        else {
          _Var1 = __uint64_identity(*local_2e0);
          local_30 = _Var1 ^ local_30;
          _Var1 = __uint64_identity(local_2e0[1]);
          local_38 = _Var1 ^ local_38;
          _Var1 = __uint64_identity(local_2e0[2]);
          local_40 = _Var1 ^ local_40;
          _Var1 = __uint64_identity(local_2e0[3]);
          local_48 = _Var1 ^ local_48;
          if (in_ESI < 6) {
            if (4 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[4]);
              local_50 = _Var1 ^ local_50;
            }
          }
          else {
            _Var1 = __uint64_identity(local_2e0[4]);
            local_50 = _Var1 ^ local_50;
            _Var1 = __uint64_identity(local_2e0[5]);
            local_58 = _Var1 ^ local_58;
            if (6 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[6]);
              local_60 = _Var1 ^ local_60;
            }
          }
        }
      }
      else {
        _Var1 = __uint64_identity(*local_2e0);
        local_30 = _Var1 ^ local_30;
        _Var1 = __uint64_identity(local_2e0[1]);
        local_38 = _Var1 ^ local_38;
        _Var1 = __uint64_identity(local_2e0[2]);
        local_40 = _Var1 ^ local_40;
        _Var1 = __uint64_identity(local_2e0[3]);
        local_48 = _Var1 ^ local_48;
        _Var1 = __uint64_identity(local_2e0[4]);
        local_50 = _Var1 ^ local_50;
        _Var1 = __uint64_identity(local_2e0[5]);
        local_58 = _Var1 ^ local_58;
        _Var1 = __uint64_identity(local_2e0[6]);
        local_60 = _Var1 ^ local_60;
        _Var1 = __uint64_identity(local_2e0[7]);
        local_68 = _Var1 ^ local_68;
        if (in_ESI < 0xc) {
          if (in_ESI < 10) {
            if (8 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[8]);
              local_70 = _Var1 ^ local_70;
            }
          }
          else {
            _Var1 = __uint64_identity(local_2e0[8]);
            local_70 = _Var1 ^ local_70;
            _Var1 = __uint64_identity(local_2e0[9]);
            local_78 = _Var1 ^ local_78;
            if (10 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[10]);
              local_80 = _Var1 ^ local_80;
            }
          }
        }
        else {
          _Var1 = __uint64_identity(local_2e0[8]);
          local_70 = _Var1 ^ local_70;
          _Var1 = __uint64_identity(local_2e0[9]);
          local_78 = _Var1 ^ local_78;
          _Var1 = __uint64_identity(local_2e0[10]);
          local_80 = _Var1 ^ local_80;
          _Var1 = __uint64_identity(local_2e0[0xb]);
          local_88 = _Var1 ^ local_88;
          if (in_ESI < 0xe) {
            if (0xc < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[0xc]);
              local_90 = _Var1 ^ local_90;
            }
          }
          else {
            _Var1 = __uint64_identity(local_2e0[0xc]);
            local_90 = _Var1 ^ local_90;
            _Var1 = __uint64_identity(local_2e0[0xd]);
            local_98 = _Var1 ^ local_98;
            if (0xe < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[0xe]);
              local_a0 = _Var1 ^ local_a0;
            }
          }
        }
      }
    }
    else {
      _Var1 = __uint64_identity(*local_2e0);
      local_30 = _Var1 ^ local_30;
      _Var1 = __uint64_identity(local_2e0[1]);
      local_38 = _Var1 ^ local_38;
      _Var1 = __uint64_identity(local_2e0[2]);
      local_40 = _Var1 ^ local_40;
      _Var1 = __uint64_identity(local_2e0[3]);
      local_48 = _Var1 ^ local_48;
      _Var1 = __uint64_identity(local_2e0[4]);
      local_50 = _Var1 ^ local_50;
      _Var1 = __uint64_identity(local_2e0[5]);
      local_58 = _Var1 ^ local_58;
      _Var1 = __uint64_identity(local_2e0[6]);
      local_60 = _Var1 ^ local_60;
      _Var1 = __uint64_identity(local_2e0[7]);
      local_68 = _Var1 ^ local_68;
      _Var1 = __uint64_identity(local_2e0[8]);
      local_70 = _Var1 ^ local_70;
      _Var1 = __uint64_identity(local_2e0[9]);
      local_78 = _Var1 ^ local_78;
      _Var1 = __uint64_identity(local_2e0[10]);
      local_80 = _Var1 ^ local_80;
      _Var1 = __uint64_identity(local_2e0[0xb]);
      local_88 = _Var1 ^ local_88;
      _Var1 = __uint64_identity(local_2e0[0xc]);
      local_90 = _Var1 ^ local_90;
      _Var1 = __uint64_identity(local_2e0[0xd]);
      local_98 = _Var1 ^ local_98;
      _Var1 = __uint64_identity(local_2e0[0xe]);
      local_a0 = _Var1 ^ local_a0;
      _Var1 = __uint64_identity(local_2e0[0xf]);
      local_a8 = _Var1 ^ local_a8;
      if (in_ESI < 0x18) {
        if (in_ESI < 0x14) {
          if (in_ESI < 0x12) {
            if (0x10 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[0x10]);
              local_b0 = _Var1 ^ local_b0;
            }
          }
          else {
            _Var1 = __uint64_identity(local_2e0[0x10]);
            local_b0 = _Var1 ^ local_b0;
            _Var1 = __uint64_identity(local_2e0[0x11]);
            local_b8 = _Var1 ^ local_b8;
            if (0x12 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[0x12]);
              local_c0 = _Var1 ^ local_c0;
            }
          }
        }
        else {
          _Var1 = __uint64_identity(local_2e0[0x10]);
          local_b0 = _Var1 ^ local_b0;
          _Var1 = __uint64_identity(local_2e0[0x11]);
          local_b8 = _Var1 ^ local_b8;
          _Var1 = __uint64_identity(local_2e0[0x12]);
          local_c0 = _Var1 ^ local_c0;
          _Var1 = __uint64_identity(local_2e0[0x13]);
          local_c8 = _Var1 ^ local_c8;
          if (in_ESI < 0x16) {
            if (0x14 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[0x14]);
              local_d0 = _Var1 ^ local_d0;
            }
          }
          else {
            _Var1 = __uint64_identity(local_2e0[0x14]);
            local_d0 = _Var1 ^ local_d0;
            _Var1 = __uint64_identity(local_2e0[0x15]);
            local_d8 = _Var1 ^ local_d8;
            if (0x16 < in_ESI) {
              _Var1 = __uint64_identity(local_2e0[0x16]);
              local_e0 = _Var1 ^ local_e0;
            }
          }
        }
      }
      else {
        _Var1 = __uint64_identity(local_2e0[0x10]);
        local_b0 = _Var1 ^ local_b0;
        _Var1 = __uint64_identity(local_2e0[0x11]);
        local_b8 = _Var1 ^ local_b8;
        _Var1 = __uint64_identity(local_2e0[0x12]);
        local_c0 = _Var1 ^ local_c0;
        _Var1 = __uint64_identity(local_2e0[0x13]);
        local_c8 = _Var1 ^ local_c8;
        _Var1 = __uint64_identity(local_2e0[0x14]);
        local_d0 = _Var1 ^ local_d0;
        _Var1 = __uint64_identity(local_2e0[0x15]);
        local_d8 = _Var1 ^ local_d8;
        _Var1 = __uint64_identity(local_2e0[0x16]);
        local_e0 = _Var1 ^ local_e0;
        _Var1 = __uint64_identity(local_2e0[0x17]);
        local_e8 = _Var1 ^ local_e8;
        if (0x18 < in_ESI) {
          _Var1 = __uint64_identity(local_2e0[0x18]);
          local_f0 = _Var1 ^ local_f0;
        }
      }
    }
    uVar2 = local_30 ^ local_58 ^ local_80 ^ local_a8 ^ local_d0;
    uVar3 = local_38 ^ local_60 ^ local_88 ^ local_b0 ^ local_d8;
    uVar4 = local_40 ^ local_68 ^ local_90 ^ local_b8 ^ local_e0;
    uVar5 = local_48 ^ local_70 ^ local_98 ^ local_c0 ^ local_e8;
    uVar6 = local_50 ^ local_78 ^ local_a0 ^ local_c8 ^ local_f0;
    uVar7 = uVar6 ^ uVar3 << 1 ^ uVar3 >> 0x3f;
    uVar8 = uVar2 ^ uVar4 << 1 ^ uVar4 >> 0x3f;
    uVar3 = uVar3 ^ uVar5 << 1 ^ uVar5 >> 0x3f;
    uVar4 = uVar4 ^ uVar6 << 1 ^ uVar6 >> 0x3f;
    uVar5 = uVar5 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    local_30 = uVar7 ^ local_30;
    uVar2 = (uVar8 ^ local_60) << 0x2c ^ (uVar8 ^ local_60) >> 0x14;
    uVar6 = (uVar3 ^ local_90) << 0x2b ^ (uVar3 ^ local_90) >> 0x15;
    uVar9 = (uVar4 ^ local_c0) << 0x15 ^ (uVar4 ^ local_c0) >> 0x2b;
    uVar10 = (uVar5 ^ local_f0) << 0xe ^ (uVar5 ^ local_f0) >> 0x32;
    uVar11 = local_30 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6 ^ 0x8000808b;
    uVar12 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar9;
    uVar6 = uVar6 ^ (uVar9 ^ 0xffffffffffffffff) & uVar10;
    uVar9 = uVar9 ^ (uVar10 ^ 0xffffffffffffffff) & local_30;
    uVar10 = uVar10 ^ (local_30 ^ 0xffffffffffffffff) & uVar2;
    uVar2 = (uVar4 ^ local_48) << 0x1c ^ (uVar4 ^ local_48) >> 0x24;
    uVar13 = (uVar5 ^ local_78) << 0x14 ^ (uVar5 ^ local_78) >> 0x2c;
    uVar14 = (uVar7 ^ local_80) << 3 ^ (uVar7 ^ local_80) >> 0x3d;
    uVar15 = (uVar8 ^ local_b0) << 0x2d ^ (uVar8 ^ local_b0) >> 0x13;
    uVar16 = (uVar3 ^ local_e0) << 0x3d ^ (uVar3 ^ local_e0) >> 3;
    uVar17 = uVar2 ^ (uVar13 ^ 0xffffffffffffffff) & uVar14;
    uVar18 = uVar13 ^ (uVar14 ^ 0xffffffffffffffff) & uVar15;
    uVar14 = uVar14 ^ (uVar15 ^ 0xffffffffffffffff) & uVar16;
    uVar15 = uVar15 ^ (uVar16 ^ 0xffffffffffffffff) & uVar2;
    uVar16 = uVar16 ^ (uVar2 ^ 0xffffffffffffffff) & uVar13;
    uVar2 = (uVar8 ^ local_38) << 1 ^ (uVar8 ^ local_38) >> 0x3f;
    uVar13 = (uVar3 ^ local_68) << 6 ^ (uVar3 ^ local_68) >> 0x3a;
    uVar19 = (uVar4 ^ local_98) << 0x19 ^ (uVar4 ^ local_98) >> 0x27;
    uVar20 = (uVar5 ^ local_c8) << 8 ^ (uVar5 ^ local_c8) >> 0x38;
    uVar21 = (uVar7 ^ local_d0) << 0x12 ^ (uVar7 ^ local_d0) >> 0x2e;
    uVar22 = uVar2 ^ (uVar13 ^ 0xffffffffffffffff) & uVar19;
    uVar23 = uVar13 ^ (uVar19 ^ 0xffffffffffffffff) & uVar20;
    uVar19 = uVar19 ^ (uVar20 ^ 0xffffffffffffffff) & uVar21;
    uVar20 = uVar20 ^ (uVar21 ^ 0xffffffffffffffff) & uVar2;
    uVar21 = uVar21 ^ (uVar2 ^ 0xffffffffffffffff) & uVar13;
    uVar2 = (uVar5 ^ local_50) << 0x1b ^ (uVar5 ^ local_50) >> 0x25;
    uVar13 = (uVar7 ^ local_58) << 0x24 ^ (uVar7 ^ local_58) >> 0x1c;
    uVar24 = (uVar8 ^ local_88) << 10 ^ (uVar8 ^ local_88) >> 0x36;
    uVar25 = (uVar3 ^ local_b8) << 0xf ^ (uVar3 ^ local_b8) >> 0x31;
    uVar26 = (uVar4 ^ local_e8) << 0x38 ^ (uVar4 ^ local_e8) >> 8;
    uVar27 = uVar2 ^ (uVar13 ^ 0xffffffffffffffff) & uVar24;
    uVar28 = uVar13 ^ (uVar24 ^ 0xffffffffffffffff) & uVar25;
    uVar24 = uVar24 ^ (uVar25 ^ 0xffffffffffffffff) & uVar26;
    uVar25 = uVar25 ^ (uVar26 ^ 0xffffffffffffffff) & uVar2;
    uVar26 = uVar26 ^ (uVar2 ^ 0xffffffffffffffff) & uVar13;
    uVar2 = (uVar3 ^ local_40) << 0x3e ^ (uVar3 ^ local_40) >> 2;
    uVar3 = (uVar4 ^ local_70) << 0x37 ^ (uVar4 ^ local_70) >> 9;
    uVar5 = (uVar5 ^ local_a0) << 0x27 ^ (uVar5 ^ local_a0) >> 0x19;
    uVar29 = (uVar7 ^ local_a8) << 0x29 ^ (uVar7 ^ local_a8) >> 0x17;
    uVar4 = (uVar8 ^ local_d8) << 2 ^ (uVar8 ^ local_d8) >> 0x3e;
    uVar13 = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar5;
    uVar7 = uVar13 ^ uVar27 ^ uVar22 ^ uVar17 ^ uVar11;
    uVar8 = uVar3 ^ (uVar5 ^ 0xffffffffffffffff) & uVar29;
    uVar30 = uVar8 ^ uVar28 ^ uVar23 ^ uVar18 ^ uVar12;
    uVar5 = uVar5 ^ (uVar29 ^ 0xffffffffffffffff) & uVar4;
    uVar31 = uVar5 ^ uVar24 ^ uVar19 ^ uVar14 ^ uVar6;
    uVar29 = uVar29 ^ (uVar4 ^ 0xffffffffffffffff) & uVar2;
    uVar32 = uVar29 ^ uVar25 ^ uVar20 ^ uVar15 ^ uVar9;
    uVar4 = uVar4 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    uVar2 = uVar4 ^ uVar26 ^ uVar21 ^ uVar16 ^ uVar10;
    uVar33 = uVar2 ^ uVar30 << 1 ^ uVar30 >> 0x3f;
    uVar34 = uVar7 ^ uVar31 << 1 ^ uVar31 >> 0x3f;
    uVar30 = uVar30 ^ uVar32 << 1 ^ uVar32 >> 0x3f;
    uVar31 = uVar31 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar32 = uVar32 ^ uVar7 << 1 ^ uVar7 >> 0x3f;
    uVar11 = uVar33 ^ uVar11;
    uVar18 = uVar34 ^ uVar18;
    uVar2 = uVar18 << 0x2c ^ uVar18 >> 0x14;
    uVar19 = uVar30 ^ uVar19;
    uVar7 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar31 ^ uVar25;
    uVar35 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar4 = uVar32 ^ uVar4;
    uVar36 = uVar4 << 0xe ^ uVar4 >> 0x32;
    uVar18 = uVar11 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7 ^ 0x800000000000008b;
    uVar37 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar35;
    uVar7 = uVar7 ^ (uVar35 ^ 0xffffffffffffffff) & uVar36;
    uVar35 = uVar35 ^ (uVar36 ^ 0xffffffffffffffff) & uVar11;
    uVar36 = uVar36 ^ (uVar11 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar31 ^ uVar9;
    uVar2 = uVar9 << 0x1c ^ uVar9 >> 0x24;
    uVar16 = uVar32 ^ uVar16;
    uVar3 = uVar16 << 0x14 ^ uVar16 >> 0x2c;
    uVar22 = uVar33 ^ uVar22;
    uVar38 = uVar22 << 3 ^ uVar22 >> 0x3d;
    uVar28 = uVar34 ^ uVar28;
    uVar4 = uVar28 << 0x2d ^ uVar28 >> 0x13;
    uVar5 = uVar30 ^ uVar5;
    uVar9 = uVar5 << 0x3d ^ uVar5 >> 3;
    uVar39 = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar38;
    uVar11 = uVar3 ^ (uVar38 ^ 0xffffffffffffffff) & uVar4;
    uVar38 = uVar38 ^ (uVar4 ^ 0xffffffffffffffff) & uVar9;
    uVar4 = uVar4 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    uVar12 = uVar34 ^ uVar12;
    uVar2 = uVar12 << 1 ^ uVar12 >> 0x3f;
    uVar14 = uVar30 ^ uVar14;
    uVar3 = uVar14 << 6 ^ uVar14 >> 0x3a;
    uVar20 = uVar31 ^ uVar20;
    uVar19 = uVar20 << 0x19 ^ uVar20 >> 0x27;
    uVar26 = uVar32 ^ uVar26;
    uVar28 = uVar26 << 8 ^ uVar26 >> 0x38;
    uVar13 = uVar33 ^ uVar13;
    uVar5 = uVar13 << 0x12 ^ uVar13 >> 0x2e;
    uVar16 = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar19;
    uVar14 = uVar3 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar5;
    uVar28 = uVar28 ^ (uVar5 ^ 0xffffffffffffffff) & uVar2;
    uVar5 = uVar5 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    uVar10 = uVar32 ^ uVar10;
    uVar2 = uVar10 << 0x1b ^ uVar10 >> 0x25;
    uVar17 = uVar33 ^ uVar17;
    uVar3 = uVar17 << 0x24 ^ uVar17 >> 0x1c;
    uVar23 = uVar34 ^ uVar23;
    uVar20 = uVar23 << 10 ^ uVar23 >> 0x36;
    uVar24 = uVar30 ^ uVar24;
    uVar25 = uVar24 << 0xf ^ uVar24 >> 0x31;
    uVar29 = uVar31 ^ uVar29;
    uVar12 = uVar29 << 0x38 ^ uVar29 >> 8;
    uVar13 = uVar2 ^ (uVar3 ^ 0xffffffffffffffff) & uVar20;
    uVar22 = uVar3 ^ (uVar20 ^ 0xffffffffffffffff) & uVar25;
    uVar20 = uVar20 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar3;
    uVar30 = uVar30 ^ uVar6;
    uVar2 = uVar30 << 0x3e ^ uVar30 >> 2;
    uVar31 = uVar31 ^ uVar15;
    uVar6 = uVar31 << 0x37 ^ uVar31 >> 9;
    uVar32 = uVar32 ^ uVar21;
    uVar21 = uVar32 << 0x27 ^ uVar32 >> 0x19;
    uVar33 = uVar33 ^ uVar27;
    uVar26 = uVar33 << 0x29 ^ uVar33 >> 0x17;
    uVar34 = uVar34 ^ uVar8;
    uVar15 = uVar34 << 2 ^ uVar34 >> 0x3e;
    uVar27 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar21;
    uVar8 = uVar27 ^ uVar13 ^ uVar16 ^ uVar39 ^ uVar18;
    uVar3 = uVar6 ^ (uVar21 ^ 0xffffffffffffffff) & uVar26;
    uVar10 = uVar3 ^ uVar22 ^ uVar14 ^ uVar11 ^ uVar37;
    uVar21 = uVar21 ^ (uVar26 ^ 0xffffffffffffffff) & uVar15;
    uVar17 = uVar21 ^ uVar20 ^ uVar19 ^ uVar38 ^ uVar7;
    uVar26 = uVar26 ^ (uVar15 ^ 0xffffffffffffffff) & uVar2;
    uVar23 = uVar26 ^ uVar25 ^ uVar28 ^ uVar4 ^ uVar35;
    uVar15 = uVar15 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
    uVar2 = uVar15 ^ uVar12 ^ uVar5 ^ uVar9 ^ uVar36;
    uVar24 = uVar2 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar29 = uVar8 ^ uVar17 << 1 ^ uVar17 >> 0x3f;
    uVar10 = uVar10 ^ uVar23 << 1 ^ uVar23 >> 0x3f;
    uVar17 = uVar17 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar23 = uVar23 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar18 = uVar24 ^ uVar18;
    uVar11 = uVar29 ^ uVar11;
    uVar2 = uVar11 << 0x2c ^ uVar11 >> 0x14;
    uVar19 = uVar10 ^ uVar19;
    uVar6 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar17 ^ uVar25;
    uVar30 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar15 = uVar23 ^ uVar15;
    uVar33 = uVar15 << 0xe ^ uVar15 >> 0x32;
    uVar11 = uVar18 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6 ^ 0x8000000000008089;
    uVar31 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar30;
    uVar6 = uVar6 ^ (uVar30 ^ 0xffffffffffffffff) & uVar33;
    uVar30 = uVar30 ^ (uVar33 ^ 0xffffffffffffffff) & uVar18;
    uVar33 = uVar33 ^ (uVar18 ^ 0xffffffffffffffff) & uVar2;
    uVar35 = uVar17 ^ uVar35;
    uVar2 = uVar35 << 0x1c ^ uVar35 >> 0x24;
    uVar9 = uVar23 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar24 ^ uVar16;
    uVar32 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar29 ^ uVar22;
    uVar15 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar21 = uVar10 ^ uVar21;
    uVar9 = uVar21 << 0x3d ^ uVar21 >> 3;
    uVar34 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar32;
    uVar18 = uVar8 ^ (uVar32 ^ 0xffffffffffffffff) & uVar15;
    uVar32 = uVar32 ^ (uVar15 ^ 0xffffffffffffffff) & uVar9;
    uVar15 = uVar15 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar37 = uVar29 ^ uVar37;
    uVar2 = uVar37 << 1 ^ uVar37 >> 0x3f;
    uVar38 = uVar10 ^ uVar38;
    uVar8 = uVar38 << 6 ^ uVar38 >> 0x3a;
    uVar28 = uVar17 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar23 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar27 = uVar24 ^ uVar27;
    uVar21 = uVar27 << 0x12 ^ uVar27 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar35 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar21;
    uVar28 = uVar28 ^ (uVar21 ^ 0xffffffffffffffff) & uVar2;
    uVar21 = uVar21 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar36 = uVar23 ^ uVar36;
    uVar2 = uVar36 << 0x1b ^ uVar36 >> 0x25;
    uVar39 = uVar24 ^ uVar39;
    uVar8 = uVar39 << 0x24 ^ uVar39 >> 0x1c;
    uVar14 = uVar29 ^ uVar14;
    uVar14 = uVar14 << 10 ^ uVar14 >> 0x36;
    uVar20 = uVar10 ^ uVar20;
    uVar25 = uVar20 << 0xf ^ uVar20 >> 0x31;
    uVar26 = uVar17 ^ uVar26;
    uVar12 = uVar26 << 0x38 ^ uVar26 >> 8;
    uVar27 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar14;
    uVar22 = uVar8 ^ (uVar14 ^ 0xffffffffffffffff) & uVar25;
    uVar14 = uVar14 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar10 = uVar10 ^ uVar7;
    uVar2 = uVar10 << 0x3e ^ uVar10 >> 2;
    uVar17 = uVar17 ^ uVar4;
    uVar7 = uVar17 << 0x37 ^ uVar17 >> 9;
    uVar23 = uVar23 ^ uVar5;
    uVar5 = uVar23 << 0x27 ^ uVar23 >> 0x19;
    uVar24 = uVar24 ^ uVar13;
    uVar20 = uVar24 << 0x29 ^ uVar24 >> 0x17;
    uVar29 = uVar29 ^ uVar3;
    uVar4 = uVar29 << 2 ^ uVar29 >> 0x3e;
    uVar13 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar5;
    uVar8 = uVar13 ^ uVar27 ^ uVar16 ^ uVar34 ^ uVar11;
    uVar3 = uVar7 ^ (uVar5 ^ 0xffffffffffffffff) & uVar20;
    uVar26 = uVar3 ^ uVar22 ^ uVar35 ^ uVar18 ^ uVar31;
    uVar5 = uVar5 ^ (uVar20 ^ 0xffffffffffffffff) & uVar4;
    uVar10 = uVar5 ^ uVar14 ^ uVar19 ^ uVar32 ^ uVar6;
    uVar20 = uVar20 ^ (uVar4 ^ 0xffffffffffffffff) & uVar2;
    uVar17 = uVar20 ^ uVar25 ^ uVar28 ^ uVar15 ^ uVar30;
    uVar4 = uVar4 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar2 = uVar4 ^ uVar12 ^ uVar21 ^ uVar9 ^ uVar33;
    uVar23 = uVar2 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar24 = uVar8 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar17 << 1 ^ uVar17 >> 0x3f;
    uVar10 = uVar10 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar17 = uVar17 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar11 = uVar23 ^ uVar11;
    uVar18 = uVar24 ^ uVar18;
    uVar2 = uVar18 << 0x2c ^ uVar18 >> 0x14;
    uVar19 = uVar26 ^ uVar19;
    uVar7 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar10 ^ uVar25;
    uVar29 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar4 = uVar17 ^ uVar4;
    uVar38 = uVar4 << 0xe ^ uVar4 >> 0x32;
    uVar18 = uVar11 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7 ^ 0x8000000000008003;
    uVar37 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar29;
    uVar7 = uVar7 ^ (uVar29 ^ 0xffffffffffffffff) & uVar38;
    uVar29 = uVar29 ^ (uVar38 ^ 0xffffffffffffffff) & uVar11;
    uVar38 = uVar38 ^ (uVar11 ^ 0xffffffffffffffff) & uVar2;
    uVar30 = uVar10 ^ uVar30;
    uVar2 = uVar30 << 0x1c ^ uVar30 >> 0x24;
    uVar9 = uVar17 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar23 ^ uVar16;
    uVar30 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar24 ^ uVar22;
    uVar4 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar5 = uVar26 ^ uVar5;
    uVar9 = uVar5 << 0x3d ^ uVar5 >> 3;
    uVar36 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar30;
    uVar11 = uVar8 ^ (uVar30 ^ 0xffffffffffffffff) & uVar4;
    uVar30 = uVar30 ^ (uVar4 ^ 0xffffffffffffffff) & uVar9;
    uVar4 = uVar4 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar31 = uVar24 ^ uVar31;
    uVar2 = uVar31 << 1 ^ uVar31 >> 0x3f;
    uVar32 = uVar26 ^ uVar32;
    uVar8 = uVar32 << 6 ^ uVar32 >> 0x3a;
    uVar28 = uVar10 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar17 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar13 = uVar23 ^ uVar13;
    uVar5 = uVar13 << 0x12 ^ uVar13 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar31 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar5;
    uVar28 = uVar28 ^ (uVar5 ^ 0xffffffffffffffff) & uVar2;
    uVar5 = uVar5 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar33 = uVar17 ^ uVar33;
    uVar2 = uVar33 << 0x1b ^ uVar33 >> 0x25;
    uVar34 = uVar23 ^ uVar34;
    uVar8 = uVar34 << 0x24 ^ uVar34 >> 0x1c;
    uVar35 = uVar24 ^ uVar35;
    uVar32 = uVar35 << 10 ^ uVar35 >> 0x36;
    uVar14 = uVar26 ^ uVar14;
    uVar25 = uVar14 << 0xf ^ uVar14 >> 0x31;
    uVar20 = uVar10 ^ uVar20;
    uVar12 = uVar20 << 0x38 ^ uVar20 >> 8;
    uVar13 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar32;
    uVar22 = uVar8 ^ (uVar32 ^ 0xffffffffffffffff) & uVar25;
    uVar32 = uVar32 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar26 = uVar26 ^ uVar6;
    uVar2 = uVar26 << 0x3e ^ uVar26 >> 2;
    uVar10 = uVar10 ^ uVar15;
    uVar6 = uVar10 << 0x37 ^ uVar10 >> 9;
    uVar17 = uVar17 ^ uVar21;
    uVar21 = uVar17 << 0x27 ^ uVar17 >> 0x19;
    uVar23 = uVar23 ^ uVar27;
    uVar14 = uVar23 << 0x29 ^ uVar23 >> 0x17;
    uVar24 = uVar24 ^ uVar3;
    uVar15 = uVar24 << 2 ^ uVar24 >> 0x3e;
    uVar27 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar21;
    uVar8 = uVar27 ^ uVar13 ^ uVar16 ^ uVar36 ^ uVar18;
    uVar3 = uVar6 ^ (uVar21 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar31 ^ uVar11 ^ uVar37;
    uVar21 = uVar21 ^ (uVar14 ^ 0xffffffffffffffff) & uVar15;
    uVar26 = uVar21 ^ uVar32 ^ uVar19 ^ uVar30 ^ uVar7;
    uVar14 = uVar14 ^ (uVar15 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar4 ^ uVar29;
    uVar15 = uVar15 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
    uVar2 = uVar15 ^ uVar12 ^ uVar5 ^ uVar9 ^ uVar38;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar18 = uVar17 ^ uVar18;
    uVar11 = uVar23 ^ uVar11;
    uVar2 = uVar11 << 0x2c ^ uVar11 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    uVar6 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    uVar24 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar15 = uVar10 ^ uVar15;
    uVar34 = uVar15 << 0xe ^ uVar15 >> 0x32;
    uVar11 = uVar18 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6 ^ 0x8000000000008002;
    uVar33 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar24;
    uVar6 = uVar6 ^ (uVar24 ^ 0xffffffffffffffff) & uVar34;
    uVar24 = uVar24 ^ (uVar34 ^ 0xffffffffffffffff) & uVar18;
    uVar34 = uVar34 ^ (uVar18 ^ 0xffffffffffffffff) & uVar2;
    uVar29 = uVar26 ^ uVar29;
    uVar2 = uVar29 << 0x1c ^ uVar29 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    uVar29 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    uVar15 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar21 = uVar20 ^ uVar21;
    uVar9 = uVar21 << 0x3d ^ uVar21 >> 3;
    uVar35 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar29;
    uVar18 = uVar8 ^ (uVar29 ^ 0xffffffffffffffff) & uVar15;
    uVar29 = uVar29 ^ (uVar15 ^ 0xffffffffffffffff) & uVar9;
    uVar15 = uVar15 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar37 = uVar23 ^ uVar37;
    uVar2 = uVar37 << 1 ^ uVar37 >> 0x3f;
    uVar30 = uVar20 ^ uVar30;
    uVar8 = uVar30 << 6 ^ uVar30 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar27 = uVar17 ^ uVar27;
    uVar21 = uVar27 << 0x12 ^ uVar27 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar30 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar21;
    uVar28 = uVar28 ^ (uVar21 ^ 0xffffffffffffffff) & uVar2;
    uVar21 = uVar21 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar38 = uVar10 ^ uVar38;
    uVar2 = uVar38 << 0x1b ^ uVar38 >> 0x25;
    uVar36 = uVar17 ^ uVar36;
    uVar8 = uVar36 << 0x24 ^ uVar36 >> 0x1c;
    uVar31 = uVar23 ^ uVar31;
    uVar31 = uVar31 << 10 ^ uVar31 >> 0x36;
    uVar32 = uVar20 ^ uVar32;
    uVar25 = uVar32 << 0xf ^ uVar32 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    uVar12 = uVar14 << 0x38 ^ uVar14 >> 8;
    uVar27 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar31;
    uVar22 = uVar8 ^ (uVar31 ^ 0xffffffffffffffff) & uVar25;
    uVar31 = uVar31 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar20 = uVar20 ^ uVar7;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar4;
    uVar7 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar5;
    uVar5 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar13;
    uVar14 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    uVar4 = uVar23 << 2 ^ uVar23 >> 0x3e;
    uVar13 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar5;
    uVar8 = uVar13 ^ uVar27 ^ uVar16 ^ uVar35 ^ uVar11;
    uVar3 = uVar7 ^ (uVar5 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar30 ^ uVar18 ^ uVar33;
    uVar5 = uVar5 ^ (uVar14 ^ 0xffffffffffffffff) & uVar4;
    uVar26 = uVar5 ^ uVar31 ^ uVar19 ^ uVar29 ^ uVar6;
    uVar14 = uVar14 ^ (uVar4 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar15 ^ uVar24;
    uVar4 = uVar4 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar2 = uVar4 ^ uVar12 ^ uVar21 ^ uVar9 ^ uVar34;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar11 = uVar17 ^ uVar11;
    uVar18 = uVar23 ^ uVar18;
    uVar2 = uVar18 << 0x2c ^ uVar18 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    uVar7 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    uVar32 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar4 = uVar10 ^ uVar4;
    uVar38 = uVar4 << 0xe ^ uVar4 >> 0x32;
    uVar18 = uVar11 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7 ^ 0x8000000000000080;
    uVar37 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar32;
    uVar7 = uVar7 ^ (uVar32 ^ 0xffffffffffffffff) & uVar38;
    uVar32 = uVar32 ^ (uVar38 ^ 0xffffffffffffffff) & uVar11;
    uVar38 = uVar38 ^ (uVar11 ^ 0xffffffffffffffff) & uVar2;
    uVar24 = uVar26 ^ uVar24;
    uVar2 = uVar24 << 0x1c ^ uVar24 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    uVar24 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    uVar4 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar5 = uVar20 ^ uVar5;
    uVar9 = uVar5 << 0x3d ^ uVar5 >> 3;
    uVar36 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar24;
    uVar11 = uVar8 ^ (uVar24 ^ 0xffffffffffffffff) & uVar4;
    uVar24 = uVar24 ^ (uVar4 ^ 0xffffffffffffffff) & uVar9;
    uVar4 = uVar4 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar33 = uVar23 ^ uVar33;
    uVar2 = uVar33 << 1 ^ uVar33 >> 0x3f;
    uVar29 = uVar20 ^ uVar29;
    uVar8 = uVar29 << 6 ^ uVar29 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar13 = uVar17 ^ uVar13;
    uVar5 = uVar13 << 0x12 ^ uVar13 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar29 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar5;
    uVar28 = uVar28 ^ (uVar5 ^ 0xffffffffffffffff) & uVar2;
    uVar5 = uVar5 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar34 = uVar10 ^ uVar34;
    uVar2 = uVar34 << 0x1b ^ uVar34 >> 0x25;
    uVar35 = uVar17 ^ uVar35;
    uVar8 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
    uVar30 = uVar23 ^ uVar30;
    uVar30 = uVar30 << 10 ^ uVar30 >> 0x36;
    uVar31 = uVar20 ^ uVar31;
    uVar25 = uVar31 << 0xf ^ uVar31 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    uVar12 = uVar14 << 0x38 ^ uVar14 >> 8;
    uVar13 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar30;
    uVar22 = uVar8 ^ (uVar30 ^ 0xffffffffffffffff) & uVar25;
    uVar30 = uVar30 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar20 = uVar20 ^ uVar6;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar15;
    uVar6 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar21;
    uVar21 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar27;
    uVar14 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    uVar15 = uVar23 << 2 ^ uVar23 >> 0x3e;
    uVar27 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar21;
    uVar8 = uVar27 ^ uVar13 ^ uVar16 ^ uVar36 ^ uVar18;
    uVar3 = uVar6 ^ (uVar21 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar29 ^ uVar11 ^ uVar37;
    uVar21 = uVar21 ^ (uVar14 ^ 0xffffffffffffffff) & uVar15;
    uVar26 = uVar21 ^ uVar30 ^ uVar19 ^ uVar24 ^ uVar7;
    uVar14 = uVar14 ^ (uVar15 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar4 ^ uVar32;
    uVar15 = uVar15 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
    uVar2 = uVar15 ^ uVar12 ^ uVar5 ^ uVar9 ^ uVar38;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar18 = uVar17 ^ uVar18;
    uVar11 = uVar23 ^ uVar11;
    uVar2 = uVar11 << 0x2c ^ uVar11 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    uVar6 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    uVar31 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar15 = uVar10 ^ uVar15;
    uVar34 = uVar15 << 0xe ^ uVar15 >> 0x32;
    uVar11 = uVar18 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6 ^ 0x800a;
    uVar33 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar31;
    uVar6 = uVar6 ^ (uVar31 ^ 0xffffffffffffffff) & uVar34;
    uVar31 = uVar31 ^ (uVar34 ^ 0xffffffffffffffff) & uVar18;
    uVar34 = uVar34 ^ (uVar18 ^ 0xffffffffffffffff) & uVar2;
    uVar32 = uVar26 ^ uVar32;
    uVar2 = uVar32 << 0x1c ^ uVar32 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    uVar32 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    uVar15 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar21 = uVar20 ^ uVar21;
    uVar9 = uVar21 << 0x3d ^ uVar21 >> 3;
    uVar35 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar32;
    uVar18 = uVar8 ^ (uVar32 ^ 0xffffffffffffffff) & uVar15;
    uVar32 = uVar32 ^ (uVar15 ^ 0xffffffffffffffff) & uVar9;
    uVar15 = uVar15 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar37 = uVar23 ^ uVar37;
    uVar2 = uVar37 << 1 ^ uVar37 >> 0x3f;
    uVar24 = uVar20 ^ uVar24;
    uVar8 = uVar24 << 6 ^ uVar24 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar27 = uVar17 ^ uVar27;
    uVar21 = uVar27 << 0x12 ^ uVar27 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar24 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar21;
    uVar28 = uVar28 ^ (uVar21 ^ 0xffffffffffffffff) & uVar2;
    uVar21 = uVar21 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar38 = uVar10 ^ uVar38;
    uVar2 = uVar38 << 0x1b ^ uVar38 >> 0x25;
    uVar36 = uVar17 ^ uVar36;
    uVar8 = uVar36 << 0x24 ^ uVar36 >> 0x1c;
    uVar29 = uVar23 ^ uVar29;
    uVar29 = uVar29 << 10 ^ uVar29 >> 0x36;
    uVar30 = uVar20 ^ uVar30;
    uVar25 = uVar30 << 0xf ^ uVar30 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    uVar12 = uVar14 << 0x38 ^ uVar14 >> 8;
    uVar27 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar29;
    uVar22 = uVar8 ^ (uVar29 ^ 0xffffffffffffffff) & uVar25;
    uVar29 = uVar29 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar20 = uVar20 ^ uVar7;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar4;
    uVar7 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar5;
    uVar5 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar13;
    uVar14 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    uVar4 = uVar23 << 2 ^ uVar23 >> 0x3e;
    uVar13 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar5;
    uVar8 = uVar13 ^ uVar27 ^ uVar16 ^ uVar35 ^ uVar11;
    uVar3 = uVar7 ^ (uVar5 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar24 ^ uVar18 ^ uVar33;
    uVar5 = uVar5 ^ (uVar14 ^ 0xffffffffffffffff) & uVar4;
    uVar26 = uVar5 ^ uVar29 ^ uVar19 ^ uVar32 ^ uVar6;
    uVar14 = uVar14 ^ (uVar4 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar15 ^ uVar31;
    uVar4 = uVar4 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar2 = uVar4 ^ uVar12 ^ uVar21 ^ uVar9 ^ uVar34;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar11 = uVar17 ^ uVar11;
    uVar18 = uVar23 ^ uVar18;
    uVar2 = uVar18 << 0x2c ^ uVar18 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    uVar7 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    uVar30 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar4 = uVar10 ^ uVar4;
    uVar38 = uVar4 << 0xe ^ uVar4 >> 0x32;
    uVar18 = uVar11 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7 ^ 0x800000008000000a;
    uVar37 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar30;
    uVar7 = uVar7 ^ (uVar30 ^ 0xffffffffffffffff) & uVar38;
    uVar30 = uVar30 ^ (uVar38 ^ 0xffffffffffffffff) & uVar11;
    uVar38 = uVar38 ^ (uVar11 ^ 0xffffffffffffffff) & uVar2;
    uVar31 = uVar26 ^ uVar31;
    uVar2 = uVar31 << 0x1c ^ uVar31 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    uVar31 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    uVar4 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar5 = uVar20 ^ uVar5;
    uVar9 = uVar5 << 0x3d ^ uVar5 >> 3;
    uVar36 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar31;
    uVar11 = uVar8 ^ (uVar31 ^ 0xffffffffffffffff) & uVar4;
    uVar31 = uVar31 ^ (uVar4 ^ 0xffffffffffffffff) & uVar9;
    uVar4 = uVar4 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar33 = uVar23 ^ uVar33;
    uVar2 = uVar33 << 1 ^ uVar33 >> 0x3f;
    uVar32 = uVar20 ^ uVar32;
    uVar8 = uVar32 << 6 ^ uVar32 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar13 = uVar17 ^ uVar13;
    uVar5 = uVar13 << 0x12 ^ uVar13 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar32 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar5;
    uVar28 = uVar28 ^ (uVar5 ^ 0xffffffffffffffff) & uVar2;
    uVar5 = uVar5 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar34 = uVar10 ^ uVar34;
    uVar2 = uVar34 << 0x1b ^ uVar34 >> 0x25;
    uVar35 = uVar17 ^ uVar35;
    uVar8 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
    uVar24 = uVar23 ^ uVar24;
    uVar24 = uVar24 << 10 ^ uVar24 >> 0x36;
    uVar29 = uVar20 ^ uVar29;
    uVar25 = uVar29 << 0xf ^ uVar29 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    uVar12 = uVar14 << 0x38 ^ uVar14 >> 8;
    uVar13 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar24;
    uVar22 = uVar8 ^ (uVar24 ^ 0xffffffffffffffff) & uVar25;
    uVar24 = uVar24 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar20 = uVar20 ^ uVar6;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar15;
    uVar6 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar21;
    uVar21 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar27;
    uVar14 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    uVar15 = uVar23 << 2 ^ uVar23 >> 0x3e;
    uVar27 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar21;
    uVar8 = uVar27 ^ uVar13 ^ uVar16 ^ uVar36 ^ uVar18;
    uVar3 = uVar6 ^ (uVar21 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar32 ^ uVar11 ^ uVar37;
    uVar21 = uVar21 ^ (uVar14 ^ 0xffffffffffffffff) & uVar15;
    uVar26 = uVar21 ^ uVar24 ^ uVar19 ^ uVar31 ^ uVar7;
    uVar14 = uVar14 ^ (uVar15 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar4 ^ uVar30;
    uVar15 = uVar15 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
    uVar2 = uVar15 ^ uVar12 ^ uVar5 ^ uVar9 ^ uVar38;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar18 = uVar17 ^ uVar18;
    uVar11 = uVar23 ^ uVar11;
    uVar2 = uVar11 << 0x2c ^ uVar11 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    uVar6 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    uVar29 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar15 = uVar10 ^ uVar15;
    uVar34 = uVar15 << 0xe ^ uVar15 >> 0x32;
    uVar11 = uVar18 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6 ^ 0x8000000080008081;
    uVar33 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar29;
    uVar6 = uVar6 ^ (uVar29 ^ 0xffffffffffffffff) & uVar34;
    uVar29 = uVar29 ^ (uVar34 ^ 0xffffffffffffffff) & uVar18;
    uVar34 = uVar34 ^ (uVar18 ^ 0xffffffffffffffff) & uVar2;
    uVar30 = uVar26 ^ uVar30;
    uVar2 = uVar30 << 0x1c ^ uVar30 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    uVar30 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    uVar15 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar21 = uVar20 ^ uVar21;
    uVar9 = uVar21 << 0x3d ^ uVar21 >> 3;
    uVar35 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar30;
    uVar18 = uVar8 ^ (uVar30 ^ 0xffffffffffffffff) & uVar15;
    uVar30 = uVar30 ^ (uVar15 ^ 0xffffffffffffffff) & uVar9;
    uVar15 = uVar15 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar37 = uVar23 ^ uVar37;
    uVar2 = uVar37 << 1 ^ uVar37 >> 0x3f;
    uVar31 = uVar20 ^ uVar31;
    uVar8 = uVar31 << 6 ^ uVar31 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar27 = uVar17 ^ uVar27;
    uVar21 = uVar27 << 0x12 ^ uVar27 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar31 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar21;
    uVar28 = uVar28 ^ (uVar21 ^ 0xffffffffffffffff) & uVar2;
    uVar21 = uVar21 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar38 = uVar10 ^ uVar38;
    uVar2 = uVar38 << 0x1b ^ uVar38 >> 0x25;
    uVar36 = uVar17 ^ uVar36;
    uVar8 = uVar36 << 0x24 ^ uVar36 >> 0x1c;
    uVar32 = uVar23 ^ uVar32;
    uVar32 = uVar32 << 10 ^ uVar32 >> 0x36;
    uVar24 = uVar20 ^ uVar24;
    uVar25 = uVar24 << 0xf ^ uVar24 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    uVar12 = uVar14 << 0x38 ^ uVar14 >> 8;
    uVar27 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar32;
    uVar22 = uVar8 ^ (uVar32 ^ 0xffffffffffffffff) & uVar25;
    uVar32 = uVar32 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar20 = uVar20 ^ uVar7;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar4;
    uVar7 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar5;
    uVar5 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar13;
    uVar14 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    uVar4 = uVar23 << 2 ^ uVar23 >> 0x3e;
    uVar13 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar5;
    uVar8 = uVar13 ^ uVar27 ^ uVar16 ^ uVar35 ^ uVar11;
    uVar3 = uVar7 ^ (uVar5 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar31 ^ uVar18 ^ uVar33;
    uVar5 = uVar5 ^ (uVar14 ^ 0xffffffffffffffff) & uVar4;
    uVar26 = uVar5 ^ uVar32 ^ uVar19 ^ uVar30 ^ uVar6;
    uVar14 = uVar14 ^ (uVar4 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar15 ^ uVar29;
    uVar4 = uVar4 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar2 = uVar4 ^ uVar12 ^ uVar21 ^ uVar9 ^ uVar34;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar11 = uVar17 ^ uVar11;
    uVar18 = uVar23 ^ uVar18;
    uVar2 = uVar18 << 0x2c ^ uVar18 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    uVar7 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    uVar24 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar4 = uVar10 ^ uVar4;
    uVar38 = uVar4 << 0xe ^ uVar4 >> 0x32;
    uVar18 = uVar11 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7 ^ 0x8000000000008080;
    uVar37 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar24;
    uVar7 = uVar7 ^ (uVar24 ^ 0xffffffffffffffff) & uVar38;
    uVar24 = uVar24 ^ (uVar38 ^ 0xffffffffffffffff) & uVar11;
    uVar38 = uVar38 ^ (uVar11 ^ 0xffffffffffffffff) & uVar2;
    uVar29 = uVar26 ^ uVar29;
    uVar2 = uVar29 << 0x1c ^ uVar29 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    uVar29 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    uVar4 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar5 = uVar20 ^ uVar5;
    uVar9 = uVar5 << 0x3d ^ uVar5 >> 3;
    uVar36 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar29;
    uVar11 = uVar8 ^ (uVar29 ^ 0xffffffffffffffff) & uVar4;
    uVar29 = uVar29 ^ (uVar4 ^ 0xffffffffffffffff) & uVar9;
    uVar4 = uVar4 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar33 = uVar23 ^ uVar33;
    uVar2 = uVar33 << 1 ^ uVar33 >> 0x3f;
    uVar30 = uVar20 ^ uVar30;
    uVar8 = uVar30 << 6 ^ uVar30 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar13 = uVar17 ^ uVar13;
    uVar5 = uVar13 << 0x12 ^ uVar13 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar30 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar5;
    uVar28 = uVar28 ^ (uVar5 ^ 0xffffffffffffffff) & uVar2;
    uVar5 = uVar5 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar34 = uVar10 ^ uVar34;
    uVar2 = uVar34 << 0x1b ^ uVar34 >> 0x25;
    uVar35 = uVar17 ^ uVar35;
    uVar8 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
    uVar31 = uVar23 ^ uVar31;
    uVar31 = uVar31 << 10 ^ uVar31 >> 0x36;
    uVar32 = uVar20 ^ uVar32;
    uVar25 = uVar32 << 0xf ^ uVar32 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    uVar12 = uVar14 << 0x38 ^ uVar14 >> 8;
    uVar13 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar31;
    uVar22 = uVar8 ^ (uVar31 ^ 0xffffffffffffffff) & uVar25;
    uVar31 = uVar31 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar20 = uVar20 ^ uVar6;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar15;
    uVar6 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar21;
    uVar21 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar27;
    uVar14 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    uVar15 = uVar23 << 2 ^ uVar23 >> 0x3e;
    uVar27 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar21;
    uVar8 = uVar27 ^ uVar13 ^ uVar16 ^ uVar36 ^ uVar18;
    uVar3 = uVar6 ^ (uVar21 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar30 ^ uVar11 ^ uVar37;
    uVar21 = uVar21 ^ (uVar14 ^ 0xffffffffffffffff) & uVar15;
    uVar26 = uVar21 ^ uVar31 ^ uVar19 ^ uVar29 ^ uVar7;
    uVar14 = uVar14 ^ (uVar15 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar4 ^ uVar24;
    uVar15 = uVar15 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
    uVar2 = uVar15 ^ uVar12 ^ uVar5 ^ uVar9 ^ uVar38;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar18 = uVar17 ^ uVar18;
    uVar11 = uVar23 ^ uVar11;
    uVar2 = uVar11 << 0x2c ^ uVar11 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    uVar6 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    uVar32 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar15 = uVar10 ^ uVar15;
    uVar34 = uVar15 << 0xe ^ uVar15 >> 0x32;
    uVar11 = uVar18 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6 ^ 0x80000001;
    uVar33 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & uVar32;
    uVar6 = uVar6 ^ (uVar32 ^ 0xffffffffffffffff) & uVar34;
    uVar32 = uVar32 ^ (uVar34 ^ 0xffffffffffffffff) & uVar18;
    uVar34 = uVar34 ^ (uVar18 ^ 0xffffffffffffffff) & uVar2;
    uVar24 = uVar26 ^ uVar24;
    uVar2 = uVar24 << 0x1c ^ uVar24 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar8 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    uVar24 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    uVar15 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar21 = uVar20 ^ uVar21;
    uVar9 = uVar21 << 0x3d ^ uVar21 >> 3;
    uVar35 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar24;
    uVar18 = uVar8 ^ (uVar24 ^ 0xffffffffffffffff) & uVar15;
    uVar24 = uVar24 ^ (uVar15 ^ 0xffffffffffffffff) & uVar9;
    uVar15 = uVar15 ^ (uVar9 ^ 0xffffffffffffffff) & uVar2;
    uVar9 = uVar9 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar37 = uVar23 ^ uVar37;
    uVar2 = uVar37 << 1 ^ uVar37 >> 0x3f;
    uVar29 = uVar20 ^ uVar29;
    uVar8 = uVar29 << 6 ^ uVar29 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    uVar19 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    uVar28 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar27 = uVar17 ^ uVar27;
    uVar21 = uVar27 << 0x12 ^ uVar27 >> 0x2e;
    uVar16 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar19;
    uVar29 = uVar8 ^ (uVar19 ^ 0xffffffffffffffff) & uVar28;
    uVar19 = uVar19 ^ (uVar28 ^ 0xffffffffffffffff) & uVar21;
    uVar28 = uVar28 ^ (uVar21 ^ 0xffffffffffffffff) & uVar2;
    uVar21 = uVar21 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar38 = uVar10 ^ uVar38;
    uVar2 = uVar38 << 0x1b ^ uVar38 >> 0x25;
    uVar36 = uVar17 ^ uVar36;
    uVar8 = uVar36 << 0x24 ^ uVar36 >> 0x1c;
    uVar30 = uVar23 ^ uVar30;
    uVar30 = uVar30 << 10 ^ uVar30 >> 0x36;
    uVar31 = uVar20 ^ uVar31;
    uVar25 = uVar31 << 0xf ^ uVar31 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    uVar12 = uVar14 << 0x38 ^ uVar14 >> 8;
    uVar27 = uVar2 ^ (uVar8 ^ 0xffffffffffffffff) & uVar30;
    uVar22 = uVar8 ^ (uVar30 ^ 0xffffffffffffffff) & uVar25;
    uVar30 = uVar30 ^ (uVar25 ^ 0xffffffffffffffff) & uVar12;
    uVar25 = uVar25 ^ (uVar12 ^ 0xffffffffffffffff) & uVar2;
    uVar12 = uVar12 ^ (uVar2 ^ 0xffffffffffffffff) & uVar8;
    uVar20 = uVar20 ^ uVar7;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar4;
    uVar7 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar5;
    uVar5 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar13;
    uVar14 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    uVar4 = uVar23 << 2 ^ uVar23 >> 0x3e;
    uVar13 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & uVar5;
    uVar8 = uVar13 ^ uVar27 ^ uVar16 ^ uVar35 ^ uVar11;
    uVar3 = uVar7 ^ (uVar5 ^ 0xffffffffffffffff) & uVar14;
    uVar20 = uVar3 ^ uVar22 ^ uVar29 ^ uVar18 ^ uVar33;
    uVar5 = uVar5 ^ (uVar14 ^ 0xffffffffffffffff) & uVar4;
    uVar26 = uVar5 ^ uVar30 ^ uVar19 ^ uVar24 ^ uVar6;
    uVar14 = uVar14 ^ (uVar4 ^ 0xffffffffffffffff) & uVar2;
    uVar10 = uVar14 ^ uVar25 ^ uVar28 ^ uVar15 ^ uVar32;
    uVar4 = uVar4 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar2 = uVar4 ^ uVar12 ^ uVar21 ^ uVar9 ^ uVar34;
    uVar17 = uVar2 ^ uVar20 << 1 ^ uVar20 >> 0x3f;
    uVar23 = uVar8 ^ uVar26 << 1 ^ uVar26 >> 0x3f;
    uVar20 = uVar20 ^ uVar10 << 1 ^ uVar10 >> 0x3f;
    uVar26 = uVar26 ^ uVar2 << 1 ^ uVar2 >> 0x3f;
    uVar10 = uVar10 ^ uVar8 << 1 ^ uVar8 >> 0x3f;
    uVar11 = uVar17 ^ uVar11;
    uVar18 = uVar23 ^ uVar18;
    uVar2 = uVar18 << 0x2c ^ uVar18 >> 0x14;
    uVar19 = uVar20 ^ uVar19;
    local_40 = uVar19 << 0x2b ^ uVar19 >> 0x15;
    uVar25 = uVar26 ^ uVar25;
    local_48 = uVar25 << 0x15 ^ uVar25 >> 0x2b;
    uVar4 = uVar10 ^ uVar4;
    local_50 = uVar4 << 0xe ^ uVar4 >> 0x32;
    local_30 = uVar11 ^ (uVar2 ^ 0xffffffffffffffff) & local_40 ^ 0x8000000080008008;
    local_38 = uVar2 ^ (local_40 ^ 0xffffffffffffffff) & local_48;
    local_40 = local_40 ^ (local_48 ^ 0xffffffffffffffff) & local_50;
    local_48 = local_48 ^ (local_50 ^ 0xffffffffffffffff) & uVar11;
    local_50 = local_50 ^ (uVar11 ^ 0xffffffffffffffff) & uVar2;
    uVar32 = uVar26 ^ uVar32;
    uVar2 = uVar32 << 0x1c ^ uVar32 >> 0x24;
    uVar9 = uVar10 ^ uVar9;
    uVar7 = uVar9 << 0x14 ^ uVar9 >> 0x2c;
    uVar16 = uVar17 ^ uVar16;
    local_68 = uVar16 << 3 ^ uVar16 >> 0x3d;
    uVar22 = uVar23 ^ uVar22;
    local_70 = uVar22 << 0x2d ^ uVar22 >> 0x13;
    uVar5 = uVar20 ^ uVar5;
    local_78 = uVar5 << 0x3d ^ uVar5 >> 3;
    local_58 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & local_68;
    local_60 = uVar7 ^ (local_68 ^ 0xffffffffffffffff) & local_70;
    local_68 = local_68 ^ (local_70 ^ 0xffffffffffffffff) & local_78;
    local_70 = local_70 ^ (local_78 ^ 0xffffffffffffffff) & uVar2;
    local_78 = local_78 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar33 = uVar23 ^ uVar33;
    uVar2 = uVar33 << 1 ^ uVar33 >> 0x3f;
    uVar24 = uVar20 ^ uVar24;
    uVar7 = uVar24 << 6 ^ uVar24 >> 0x3a;
    uVar28 = uVar26 ^ uVar28;
    local_90 = uVar28 << 0x19 ^ uVar28 >> 0x27;
    uVar12 = uVar10 ^ uVar12;
    local_98 = uVar12 << 8 ^ uVar12 >> 0x38;
    uVar13 = uVar17 ^ uVar13;
    local_a0 = uVar13 << 0x12 ^ uVar13 >> 0x2e;
    local_80 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & local_90;
    local_88 = uVar7 ^ (local_90 ^ 0xffffffffffffffff) & local_98;
    local_90 = local_90 ^ (local_98 ^ 0xffffffffffffffff) & local_a0;
    local_98 = local_98 ^ (local_a0 ^ 0xffffffffffffffff) & uVar2;
    local_a0 = local_a0 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar34 = uVar10 ^ uVar34;
    uVar2 = uVar34 << 0x1b ^ uVar34 >> 0x25;
    uVar35 = uVar17 ^ uVar35;
    uVar7 = uVar35 << 0x24 ^ uVar35 >> 0x1c;
    uVar29 = uVar23 ^ uVar29;
    local_b8 = uVar29 << 10 ^ uVar29 >> 0x36;
    uVar30 = uVar20 ^ uVar30;
    local_c0 = uVar30 << 0xf ^ uVar30 >> 0x31;
    uVar14 = uVar26 ^ uVar14;
    local_c8 = uVar14 << 0x38 ^ uVar14 >> 8;
    local_a8 = uVar2 ^ (uVar7 ^ 0xffffffffffffffff) & local_b8;
    local_b0 = uVar7 ^ (local_b8 ^ 0xffffffffffffffff) & local_c0;
    local_b8 = local_b8 ^ (local_c0 ^ 0xffffffffffffffff) & local_c8;
    local_c0 = local_c0 ^ (local_c8 ^ 0xffffffffffffffff) & uVar2;
    local_c8 = local_c8 ^ (uVar2 ^ 0xffffffffffffffff) & uVar7;
    uVar20 = uVar20 ^ uVar6;
    uVar2 = uVar20 << 0x3e ^ uVar20 >> 2;
    uVar26 = uVar26 ^ uVar15;
    uVar6 = uVar26 << 0x37 ^ uVar26 >> 9;
    uVar10 = uVar10 ^ uVar21;
    local_e0 = uVar10 << 0x27 ^ uVar10 >> 0x19;
    uVar17 = uVar17 ^ uVar27;
    local_e8 = uVar17 << 0x29 ^ uVar17 >> 0x17;
    uVar23 = uVar23 ^ uVar3;
    local_f0 = uVar23 << 2 ^ uVar23 >> 0x3e;
    local_d0 = uVar2 ^ (uVar6 ^ 0xffffffffffffffff) & local_e0;
    local_d8 = uVar6 ^ (local_e0 ^ 0xffffffffffffffff) & local_e8;
    local_e0 = local_e0 ^ (local_e8 ^ 0xffffffffffffffff) & local_f0;
    local_e8 = local_e8 ^ (local_f0 ^ 0xffffffffffffffff) & uVar2;
    local_f0 = local_f0 ^ (uVar2 ^ 0xffffffffffffffff) & uVar6;
    local_2e0 = local_2e0 + in_ESI;
  }
  *in_RDI = local_30;
  in_RDI[1] = local_38;
  in_RDI[2] = local_40;
  in_RDI[3] = local_48;
  in_RDI[4] = local_50;
  in_RDI[5] = local_58;
  in_RDI[6] = local_60;
  in_RDI[7] = local_68;
  in_RDI[8] = local_70;
  in_RDI[9] = local_78;
  in_RDI[10] = local_80;
  in_RDI[0xb] = local_88;
  in_RDI[0xc] = local_90;
  in_RDI[0xd] = local_98;
  in_RDI[0xe] = local_a0;
  in_RDI[0xf] = local_a8;
  in_RDI[0x10] = local_b0;
  in_RDI[0x11] = local_b8;
  in_RDI[0x12] = local_c0;
  in_RDI[0x13] = local_c8;
  in_RDI[0x14] = local_d0;
  in_RDI[0x15] = local_d8;
  in_RDI[0x16] = local_e0;
  in_RDI[0x17] = local_e8;
  in_RDI[0x18] = local_f0;
  return in_RCX - local_20;
}

Assistant:

size_t KeccakP1600_12rounds_FastLoop_Absorb(void *state, unsigned int laneCount, const unsigned char *data, size_t dataByteLen)
{
    size_t originalDataByteLen = dataByteLen;
    declareABCDE
    #ifndef KeccakP1600_fullUnrolling
    unsigned int i;
    #endif
    uint64_t *stateAsLanes = (uint64_t*)state;
    uint64_t *inDataAsLanes = (uint64_t*)data;

    copyFromState(A, stateAsLanes)
    while(dataByteLen >= laneCount*8) {
        addInput(A, inDataAsLanes, laneCount)
        rounds12
        inDataAsLanes += laneCount;
        dataByteLen -= laneCount*8;
    }
    copyToState(stateAsLanes, A)
    return originalDataByteLen - dataByteLen;
}